

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O1

int4 __thiscall
ConstructTpl::fillinBuild
          (ConstructTpl *this,vector<int,_std::allocator<int>_> *check,AddrSpace *const_space)

{
  int iVar1;
  uint uVar2;
  pointer ppOVar3;
  pointer piVar4;
  VarnodeTpl *this_00;
  pointer ppOVar5;
  uintb val;
  uint uVar6;
  ConstructTpl *pCVar7;
  OpTpl *op;
  OpTpl *local_a0;
  AddrSpace *local_98;
  ConstTpl local_90;
  ConstTpl local_70;
  ConstTpl local_50;
  
  ppOVar5 = (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar3 = (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar5 != ppOVar3) {
    piVar4 = (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pCVar7 = this;
    do {
      local_a0 = *ppOVar5;
      if (local_a0->opc == CPUI_MULTIEQUAL) {
        iVar1 = (int)((*(local_a0->input).
                        super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->offset).value_real;
        uVar2 = piVar4[iVar1];
        uVar6 = uVar2;
        if (uVar2 == 0) {
          piVar4[iVar1] = 1;
          uVar6 = (uint)pCVar7;
        }
        pCVar7 = (ConstructTpl *)(ulong)uVar6;
        if (uVar2 != 0) {
          return uVar6;
        }
      }
      ppOVar5 = ppOVar5 + 1;
    } while (ppOVar5 != ppOVar3);
  }
  piVar4 = (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    val = 0;
    local_98 = const_space;
    do {
      if (piVar4[val] == 0) {
        local_a0 = (OpTpl *)operator_new(0x28);
        (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_a0->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0->opc = CPUI_MULTIEQUAL;
        local_a0->output = (VarnodeTpl *)0x0;
        this_00 = (VarnodeTpl *)operator_new(0x68);
        ConstTpl::ConstTpl(&local_90,local_98);
        ConstTpl::ConstTpl(&local_50,real,val);
        ConstTpl::ConstTpl(&local_70,real,4);
        VarnodeTpl::VarnodeTpl(this_00,&local_90,&local_50,&local_70);
        OpTpl::addInput(local_a0,this_00);
        std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::insert
                  (&this->vec,
                   (const_iterator)
                   (this->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_a0);
      }
      val = val + 1;
      piVar4 = (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (val < (ulong)((long)(check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
  }
  return 0;
}

Assistant:

int4 ConstructTpl::fillinBuild(vector<int4> &check,AddrSpace *const_space)

{ // Make sure there is a build statement for all subtable params
  // Return 0 upon success, 1 if there is a duplicate BUILD, 2 if there is a build for a non-subtable
  vector<OpTpl *>::iterator iter;
  OpTpl *op;
  VarnodeTpl *indvn;

  for(iter=vec.begin();iter!=vec.end();++iter) {
    op = *iter;
    if (op->getOpcode() == BUILD) {
      int4 index = op->getIn(0)->getOffset().getReal();
      if (check[index] != 0)
	return check[index];	// Duplicate BUILD statement or non-subtable
      check[index] = 1;		// Mark to avoid future duplicate build
    }
  }
  for(int4 i=0;i<check.size();++i) {
    if (check[i] == 0) {	// Didn't see a BUILD statement
      op = new OpTpl(BUILD);
      indvn = new VarnodeTpl(ConstTpl(const_space),
			      ConstTpl(ConstTpl::real,i),
			      ConstTpl(ConstTpl::real,4));
      op->addInput(indvn);
      vec.insert(vec.begin(),op);
    }
  }
  return 0;
}